

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

ConstTokenOrSyntax * __thiscall
slang::syntax::RandSequenceStatementSyntax::getChild
          (ConstTokenOrSyntax *__return_storage_ptr__,RandSequenceStatementSyntax *this,size_t index
          )

{
  Token token;
  Token token_00;
  Token token_01;
  Token token_02;
  Token token_03;
  SyntaxNode *local_a0;
  SyntaxNode *local_90;
  size_t index_local;
  RandSequenceStatementSyntax *this_local;
  
  switch(index) {
  case 0:
    ConstTokenOrSyntax::ConstTokenOrSyntax
              (__return_storage_ptr__,&((this->super_StatementSyntax).label)->super_SyntaxNode);
    break;
  case 1:
    local_90 = (SyntaxNode *)0x0;
    if (this != (RandSequenceStatementSyntax *)0xffffffffffffffe8) {
      local_90 = &(this->super_StatementSyntax).attributes.super_SyntaxListBase.super_SyntaxNode;
    }
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,local_90);
    break;
  case 2:
    token.kind = (this->randsequence).kind;
    token._2_1_ = (this->randsequence).field_0x2;
    token.numFlags.raw = (this->randsequence).numFlags.raw;
    token.rawLen = (this->randsequence).rawLen;
    token.info = (this->randsequence).info;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,token);
    break;
  case 3:
    token_00.kind = (this->openParen).kind;
    token_00._2_1_ = (this->openParen).field_0x2;
    token_00.numFlags.raw = (this->openParen).numFlags.raw;
    token_00.rawLen = (this->openParen).rawLen;
    token_00.info = (this->openParen).info;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,token_00);
    break;
  case 4:
    token_01.kind = (this->firstProduction).kind;
    token_01._2_1_ = (this->firstProduction).field_0x2;
    token_01.numFlags.raw = (this->firstProduction).numFlags.raw;
    token_01.rawLen = (this->firstProduction).rawLen;
    token_01.info = (this->firstProduction).info;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,token_01);
    break;
  case 5:
    token_02.kind = (this->closeParen).kind;
    token_02._2_1_ = (this->closeParen).field_0x2;
    token_02.numFlags.raw = (this->closeParen).numFlags.raw;
    token_02.rawLen = (this->closeParen).rawLen;
    token_02.info = (this->closeParen).info;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,token_02);
    break;
  case 6:
    local_a0 = (SyntaxNode *)0x0;
    if (this != (RandSequenceStatementSyntax *)0xffffffffffffff78) {
      local_a0 = &(this->productions).super_SyntaxListBase.super_SyntaxNode;
    }
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,local_a0);
    break;
  case 7:
    token_03.kind = (this->endsequence).kind;
    token_03._2_1_ = (this->endsequence).field_0x2;
    token_03.numFlags.raw = (this->endsequence).numFlags.raw;
    token_03.rawLen = (this->endsequence).rawLen;
    token_03.info = (this->endsequence).info;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,token_03);
    break;
  default:
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,(nullptr_t)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

ConstTokenOrSyntax RandSequenceStatementSyntax::getChild(size_t index) const {
    switch (index) {
        case 0: return label;
        case 1: return &attributes;
        case 2: return randsequence;
        case 3: return openParen;
        case 4: return firstProduction;
        case 5: return closeParen;
        case 6: return &productions;
        case 7: return endsequence;
        default: return nullptr;
    }
}